

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus AddThumbPredicate(cs_struct *ud,MCInst *MI)

{
  ushort uVar1;
  MCOperandInfo *pMVar2;
  _Bool _Var3;
  uint uVar4;
  MCOperand *pMVar5;
  uint local_3c;
  uint local_38;
  uint CC;
  uint i;
  unsigned_short NumOps;
  MCOperandInfo *OpInfo;
  DecodeStatus S;
  MCInst *MI_local;
  cs_struct *ud_local;
  
  OpInfo._4_4_ = MCDisassembler_Success;
  uVar4 = MCInst_getOpcode(MI);
  if (uVar4 == 0x8fc) {
LAB_0014e801:
    _Var3 = ITStatus_instrInITBlock(&ud->ITBlock);
    if ((_Var3) && (_Var3 = ITStatus_instrLastInITBlock(&ud->ITBlock), !_Var3)) {
      OpInfo._4_4_ = MCDisassembler_SoftFail;
    }
  }
  else {
    if ((uVar4 != 0x904) && (2 < uVar4 - 0x90f)) {
      if ((uVar4 == 0xa51) || ((uVar4 == 0xa53 || (uVar4 == 0xa8c)))) goto LAB_0014e801;
      if ((((uVar4 != 0xa98) && (1 < uVar4 - 0xa9a)) && (uVar4 != 0xaa0)) &&
         ((uVar4 != 0xabc && (uVar4 != 0xacc)))) goto LAB_0014e830;
    }
    _Var3 = ITStatus_instrInITBlock(&ud->ITBlock);
    if (!_Var3) {
      return MCDisassembler_Success;
    }
    OpInfo._4_4_ = MCDisassembler_SoftFail;
  }
LAB_0014e830:
  local_3c = ITStatus_getITCC(&ud->ITBlock);
  if (local_3c == 0xf) {
    local_3c = 0xe;
  }
  _Var3 = ITStatus_instrInITBlock(&ud->ITBlock);
  if (_Var3) {
    ITStatus_advanceITState(&ud->ITBlock);
  }
  uVar4 = MCInst_getOpcode(MI);
  pMVar2 = ARMInsts[uVar4].OpInfo;
  uVar4 = MCInst_getOpcode(MI);
  uVar1 = ARMInsts[uVar4].NumOperands;
  for (local_38 = 0; (local_38 < uVar1 && (uVar4 = MCInst_getNumOperands(MI), local_38 != uVar4));
      local_38 = local_38 + 1) {
    _Var3 = MCOperandInfo_isPredicate(pMVar2 + local_38);
    if (_Var3) {
      pMVar5 = MCOperand_CreateImm1(MI,(ulong)local_3c);
      MCInst_insert0(MI,local_38,pMVar5);
      if (local_3c == 0xe) {
        pMVar5 = MCOperand_CreateReg1(MI,0);
        MCInst_insert0(MI,local_38 + 1,pMVar5);
      }
      else {
        pMVar5 = MCOperand_CreateReg1(MI,3);
        MCInst_insert0(MI,local_38 + 1,pMVar5);
      }
      return OpInfo._4_4_;
    }
  }
  pMVar5 = MCOperand_CreateImm1(MI,(ulong)local_3c);
  MCInst_insert0(MI,local_38,pMVar5);
  if (local_3c == 0xe) {
    pMVar5 = MCOperand_CreateReg1(MI,0);
    MCInst_insert0(MI,local_38 + 1,pMVar5);
  }
  else {
    pMVar5 = MCOperand_CreateReg1(MI,3);
    MCInst_insert0(MI,local_38 + 1,pMVar5);
  }
  return OpInfo._4_4_;
}

Assistant:

static DecodeStatus AddThumbPredicate(cs_struct *ud, MCInst *MI)
{
	DecodeStatus S = MCDisassembler_Success;
	MCOperandInfo *OpInfo;
	unsigned short NumOps;
	unsigned int i;
	unsigned CC;

	// A few instructions actually have predicates encoded in them.  Don't
	// try to overwrite it if we're seeing one of those.
	switch (MCInst_getOpcode(MI)) {
		case ARM_tBcc:
		case ARM_t2Bcc:
		case ARM_tCBZ:
		case ARM_tCBNZ:
		case ARM_tCPS:
		case ARM_t2CPS3p:
		case ARM_t2CPS2p:
		case ARM_t2CPS1p:
		case ARM_tMOVSr:
		case ARM_tSETEND:
			// Some instructions (mostly conditional branches) are not
			// allowed in IT blocks.
			if (ITStatus_instrInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			else
				return MCDisassembler_Success;
			break;
		case ARM_tB:
		case ARM_t2B:
		case ARM_t2TBB:
		case ARM_t2TBH:
			// Some instructions (mostly unconditional branches) can
			// only appears at the end of, or outside of, an IT.
			//if (ITBlock.instrInITBlock() && !ITBlock.instrLastInITBlock())
			if (ITStatus_instrInITBlock(&(ud->ITBlock)) && !ITStatus_instrLastInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}

	// If we're in an IT block, base the predicate on that.  Otherwise,
	// assume a predicate of AL.
	CC = ITStatus_getITCC(&(ud->ITBlock));
	if (CC == 0xF) 
		CC = ARMCC_AL;
	if (ITStatus_instrInITBlock(&(ud->ITBlock)))
		ITStatus_advanceITState(&(ud->ITBlock));

	OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;

	for (i = 0; i < NumOps; ++i) {
		if (i == MCInst_getNumOperands(MI)) break;
		if (MCOperandInfo_isPredicate(&OpInfo[i])) {
			MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
			if (CC == ARMCC_AL)
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
			else
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));
			return S;
		}
	}

	MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
	if (CC == ARMCC_AL)
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
	else
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));

	return S;
}